

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_inlinedHaarWavelets_precheck_boundaries
               (integral_image *iimage,interest_point *ipoint)

{
  int scale_00;
  int iVar1;
  int iVar2;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int i_2;
  float norm_factor;
  float d4_1;
  float d3_1;
  float d2_1;
  float d1_1;
  float gauss_s2_1;
  float rry_1;
  float rrx_1;
  float ry_1;
  float rx_1;
  float gauss_s1_1;
  int sample_x_sub_int_scale_1;
  float xs_sub_sample_x_squared_1;
  float xs_sub_sample_x_1;
  int sample_x_1;
  int k_1;
  int sample_y_sub_int_scale_1;
  float ys_sub_sample_y_squared_1;
  float ys_sub_sample_y_1;
  int sample_y_1;
  int l_1;
  int ys_1;
  int xs_1;
  float mdy_1;
  float mdx_1;
  float dy_1;
  float dx_1;
  float cy_squared_1;
  int j_1;
  float cx_squared_1;
  int i_1;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  int sample_x_sub_int_scale;
  float xs_sub_sample_x_squared;
  float xs_sub_sample_x;
  int sample_x;
  int k;
  int sample_y_sub_int_scale;
  float ys_sub_sample_y_squared;
  float ys_sub_sample_y;
  int sample_y;
  int l;
  int ys;
  int xs;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float cy_squared;
  int j;
  float cx_squared;
  int i;
  float cy;
  float cx;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y;
  float ipoint_x;
  float g2_factor;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_148;
  float local_124;
  float local_120;
  float local_11c;
  int local_118;
  float local_114;
  float local_110;
  int local_10c;
  int local_108;
  int local_104;
  float local_100;
  float local_fc;
  int local_f8;
  int local_f4;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  float fVar55;
  undefined4 in_stack_ffffffffffffff1c;
  float fVar56;
  float local_e0;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int iVar57;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar58;
  int local_90;
  int local_7c;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  int local_5c;
  int local_54;
  float local_50;
  float local_4c;
  float local_48;
  int local_44;
  
  fVar13 = in_RSI[2];
  auVar40._8_4_ = 0x80000000;
  auVar40._0_8_ = 0x8000000080000000;
  auVar40._12_4_ = 0x80000000;
  auVar5._8_4_ = 0x3effffff;
  auVar5._0_8_ = 0x3effffff3effffff;
  auVar5._12_4_ = 0x3effffff;
  auVar3 = vpternlogd_avx512vl(auVar5,ZEXT416((uint)fVar13),auVar40,0xf8);
  auVar3 = vroundss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)(fVar13 + auVar3._0_4_)),0xb);
  scale_00 = (int)auVar3._0_4_;
  fVar7 = -0.08 / (fVar13 * fVar13);
  fVar9 = *in_RSI;
  auVar41._8_4_ = 0x80000000;
  auVar41._0_8_ = 0x8000000080000000;
  auVar41._12_4_ = 0x80000000;
  auVar6._8_4_ = 0x3effffff;
  auVar6._0_8_ = 0x3effffff3effffff;
  auVar6._12_4_ = 0x3effffff;
  auVar3 = vpternlogd_avx512vl(auVar6,ZEXT416((uint)fVar9),auVar41,0xf8);
  auVar3 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)(fVar9 + auVar3._0_4_)),0xb);
  auVar38._0_8_ = (double)auVar3._0_4_;
  auVar38._8_8_ = 0;
  auVar3._0_8_ = (double)fVar13;
  auVar3._8_8_ = 0;
  auVar3 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar3,auVar38);
  fVar8 = (float)auVar3._0_8_;
  fVar9 = in_RSI[1];
  auVar42._8_4_ = 0x80000000;
  auVar42._0_8_ = 0x8000000080000000;
  auVar42._12_4_ = 0x80000000;
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  auVar3 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar9),auVar42,0xf8);
  auVar3 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)(fVar9 + auVar3._0_4_)),0xb);
  auVar39._0_8_ = (double)auVar3._0_4_;
  auVar39._8_8_ = 0;
  auVar4._0_8_ = (double)fVar13;
  auVar4._8_8_ = 0;
  auVar3 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar4,auVar39);
  fVar9 = (float)auVar3._0_8_;
  local_44 = 0;
  local_48 = 0.0;
  local_4c = -2.5;
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar13),ZEXT416((uint)fVar8)
                          );
  auVar43._8_4_ = 0x80000000;
  auVar43._0_8_ = 0x8000000080000000;
  auVar43._12_4_ = 0x80000000;
  auVar16._8_4_ = 0x3effffff;
  auVar16._0_8_ = 0x3effffff3effffff;
  auVar16._12_4_ = 0x3effffff;
  auVar4 = vpternlogd_avx512vl(auVar16,auVar3,auVar43,0xf8);
  auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
  if (0 < (int)auVar3._0_4_ - scale_00) {
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar13),
                             ZEXT416((uint)fVar9));
    auVar44._8_4_ = 0x80000000;
    auVar44._0_8_ = 0x8000000080000000;
    auVar44._12_4_ = 0x80000000;
    auVar17._8_4_ = 0x3effffff;
    auVar17._0_8_ = 0x3effffff3effffff;
    auVar17._12_4_ = 0x3effffff;
    auVar4 = vpternlogd_avx512vl(auVar17,auVar3,auVar44,0xf8);
    auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
    if (0 < (int)auVar3._0_4_ - scale_00) {
      auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar13),
                               ZEXT416((uint)fVar8));
      auVar45._8_4_ = 0x80000000;
      auVar45._0_8_ = 0x8000000080000000;
      auVar45._12_4_ = 0x80000000;
      auVar18._8_4_ = 0x3effffff;
      auVar18._0_8_ = 0x3effffff3effffff;
      auVar18._12_4_ = 0x3effffff;
      auVar4 = vpternlogd_avx512vl(auVar18,auVar3,auVar45,0xf8);
      auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
      if ((int)auVar3._0_4_ + scale_00 <= in_RDI->width) {
        auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar13),
                                 ZEXT416((uint)fVar9));
        auVar46._8_4_ = 0x80000000;
        auVar46._0_8_ = 0x8000000080000000;
        auVar46._12_4_ = 0x80000000;
        auVar19._8_4_ = 0x3effffff;
        auVar19._0_8_ = 0x3effffff3effffff;
        auVar19._12_4_ = 0x3effffff;
        auVar4 = vpternlogd_avx512vl(auVar19,auVar3,auVar46,0xf8);
        auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
        if ((int)auVar3._0_4_ + scale_00 <= in_RDI->height) {
          for (iVar58 = -8; iVar58 < 8; iVar58 = iVar58 + 5) {
            local_4c = local_4c + 1.0;
            fVar11 = local_4c * local_4c;
            local_50 = -2.5;
            for (iVar57 = -8; iVar57 < 8; iVar57 = iVar57 + 5) {
              local_50 = local_50 + 1.0;
              fVar12 = local_50 * local_50;
              fVar10 = 0.0;
              local_e0 = 0.0;
              fVar56 = 0.0;
              fVar55 = 0.0;
              auVar29._0_4_ = (float)iVar58;
              auVar29._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar29,ZEXT416((uint)fVar8));
              auVar51._8_4_ = 0x80000000;
              auVar51._0_8_ = 0x8000000080000000;
              auVar51._12_4_ = 0x80000000;
              auVar30._8_4_ = 0x3effffff;
              auVar30._0_8_ = 0x3effffff3effffff;
              auVar30._12_4_ = 0x3effffff;
              auVar4 = vpternlogd_avx512vl(auVar30,auVar3,auVar51,0xf8);
              auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
              iVar1 = (int)auVar3._0_4_;
              auVar31._0_4_ = (float)iVar57;
              auVar31._4_12_ = auVar3._4_12_;
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar31,ZEXT416((uint)fVar9));
              auVar52._8_4_ = 0x80000000;
              auVar52._0_8_ = 0x8000000080000000;
              auVar52._12_4_ = 0x80000000;
              auVar32._8_4_ = 0x3effffff;
              auVar32._0_8_ = 0x3effffff3effffff;
              auVar32._12_4_ = 0x3effffff;
              auVar4 = vpternlogd_avx512vl(auVar32,auVar3,auVar52,0xf8);
              auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
              auVar14 = ZEXT1664(auVar3);
              iVar2 = (int)auVar3._0_4_;
              for (local_f4 = iVar57 + -4; local_f4 < iVar57 + 5; local_f4 = local_f4 + 1) {
                auVar33._0_4_ = (float)local_f4;
                auVar33._4_12_ = auVar14._4_12_;
                auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar33,ZEXT416((uint)fVar9));
                auVar53._8_4_ = 0x80000000;
                auVar53._0_8_ = 0x8000000080000000;
                auVar53._12_4_ = 0x80000000;
                auVar34._8_4_ = 0x3effffff;
                auVar34._0_8_ = 0x3effffff3effffff;
                auVar34._12_4_ = 0x3effffff;
                auVar4 = vpternlogd_avx512vl(auVar34,auVar3,auVar53,0xf8);
                auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
                local_f8 = (int)auVar3._0_4_;
                local_fc = (float)iVar2 - (float)local_f8;
                local_100 = local_fc * local_fc;
                local_104 = local_f8 - scale_00;
                for (local_108 = iVar58 + -4; auVar14 = ZEXT464(0), local_108 < iVar58 + 5;
                    local_108 = local_108 + 1) {
                  auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)(float)local_108),
                                           ZEXT416((uint)fVar8));
                  auVar54._8_4_ = 0x80000000;
                  auVar54._0_8_ = 0x8000000080000000;
                  auVar54._12_4_ = 0x80000000;
                  auVar35._8_4_ = 0x3effffff;
                  auVar35._0_8_ = 0x3effffff3effffff;
                  auVar35._12_4_ = 0x3effffff;
                  auVar4 = vpternlogd_avx512vl(auVar35,auVar3,auVar54,0xf8);
                  auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
                  local_10c = (int)auVar3._0_4_;
                  local_110 = (float)iVar1 - (float)local_10c;
                  local_114 = local_110 * local_110;
                  local_118 = local_10c - scale_00;
                  local_11c = expf(fVar7 * (local_114 + local_100));
                  local_120 = 0.0;
                  local_124 = 0.0;
                  haarXY_unconditional(in_RDI,local_104,local_118,scale_00,&local_120,&local_124);
                  fVar10 = local_11c * local_124 + fVar10;
                  local_e0 = local_11c * local_120 + local_e0;
                  auVar36._8_4_ = 0x7fffffff;
                  auVar36._0_8_ = 0x7fffffff7fffffff;
                  auVar36._12_4_ = 0x7fffffff;
                  auVar3 = vpand_avx(ZEXT416((uint)(local_11c * local_124)),auVar36);
                  fVar56 = auVar3._0_4_ + fVar56;
                  auVar37._8_4_ = 0x7fffffff;
                  auVar37._0_8_ = 0x7fffffff7fffffff;
                  auVar37._12_4_ = 0x7fffffff;
                  auVar3 = vpand_avx(ZEXT416((uint)(local_11c * local_120)),auVar37);
                  fVar55 = auVar3._0_4_ + fVar55;
                }
              }
              fVar12 = expf((fVar11 + fVar12) * -0.22222222);
              fVar10 = fVar10 * fVar12;
              local_e0 = local_e0 * fVar12;
              fVar56 = fVar56 * fVar12;
              fVar55 = fVar55 * fVar12;
              in_RSI[(long)local_44 + 5] = fVar10;
              in_RSI[(long)(local_44 + 1) + 5] = local_e0;
              in_RSI[(long)(local_44 + 2) + 5] = fVar56;
              in_RSI[(long)(local_44 + 3) + 5] = fVar55;
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),
                                       ZEXT416((uint)(local_e0 * local_e0)));
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56),auVar3);
              auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55),auVar3);
              local_48 = auVar3._0_4_ + local_48;
              local_44 = local_44 + 4;
            }
          }
          goto LAB_00183212;
        }
      }
    }
  }
  for (local_54 = -8; local_54 < 8; local_54 = local_54 + 5) {
    local_4c = local_4c + 1.0;
    local_50 = -2.5;
    for (local_5c = -8; local_5c < 8; local_5c = local_5c + 5) {
      local_50 = local_50 + 1.0;
      local_64 = 0.0;
      local_68 = 0.0;
      local_6c = 0.0;
      local_70 = 0.0;
      auVar20._0_4_ = (float)local_54;
      auVar20._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar20,ZEXT416((uint)fVar8));
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      auVar21._8_4_ = 0x3effffff;
      auVar21._0_8_ = 0x3effffff3effffff;
      auVar21._12_4_ = 0x3effffff;
      auVar4 = vpternlogd_avx512vl(auVar21,auVar3,auVar47,0xf8);
      auVar3 = vroundss_avx(auVar3,ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_)),0xb);
      auVar22._0_4_ = (float)local_5c;
      auVar22._4_12_ = auVar3._4_12_;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar22,ZEXT416((uint)fVar9));
      auVar48._8_4_ = 0x80000000;
      auVar48._0_8_ = 0x8000000080000000;
      auVar48._12_4_ = 0x80000000;
      auVar23._8_4_ = 0x3effffff;
      auVar23._0_8_ = 0x3effffff3effffff;
      auVar23._12_4_ = 0x3effffff;
      auVar5 = vpternlogd_avx512vl(auVar23,auVar4,auVar48,0xf8);
      auVar4 = vroundss_avx(auVar4,ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_)),0xb);
      auVar14 = ZEXT1664(auVar4);
      for (local_7c = local_5c + -4; local_7c < local_5c + 5; local_7c = local_7c + 1) {
        auVar24._0_4_ = (float)local_7c;
        auVar24._4_12_ = auVar14._4_12_;
        auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar24,ZEXT416((uint)fVar9));
        auVar49._8_4_ = 0x80000000;
        auVar49._0_8_ = 0x8000000080000000;
        auVar49._12_4_ = 0x80000000;
        auVar25._8_4_ = 0x3effffff;
        auVar25._0_8_ = 0x3effffff3effffff;
        auVar25._12_4_ = 0x3effffff;
        auVar6 = vpternlogd_avx512vl(auVar25,auVar5,auVar49,0xf8);
        auVar5 = vroundss_avx(auVar5,ZEXT416((uint)(auVar5._0_4_ + auVar6._0_4_)),0xb);
        fVar11 = (float)(int)auVar4._0_4_ - (float)(int)auVar5._0_4_;
        for (local_90 = local_54 + -4; auVar14 = ZEXT464(0), local_90 < local_54 + 5;
            local_90 = local_90 + 1) {
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)(float)local_90),
                                   ZEXT416((uint)fVar8));
          auVar50._8_4_ = 0x80000000;
          auVar50._0_8_ = 0x8000000080000000;
          auVar50._12_4_ = 0x80000000;
          auVar26._8_4_ = 0x3effffff;
          auVar26._0_8_ = 0x3effffff3effffff;
          auVar26._12_4_ = 0x3effffff;
          auVar6 = vpternlogd_avx512vl(auVar26,auVar5,auVar50,0xf8);
          auVar5 = vroundss_avx(auVar5,ZEXT416((uint)(auVar5._0_4_ + auVar6._0_4_)),0xb);
          fVar10 = (float)(int)auVar3._0_4_ - (float)(int)auVar5._0_4_;
          fVar10 = expf(fVar7 * (fVar10 * fVar10 + fVar11 * fVar11));
          haarXY_precheck_boundaries
                    ((integral_image *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                     ,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                     (float *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          local_64 = fVar10 * 0.0 + local_64;
          local_68 = fVar10 * 0.0 + local_68;
          auVar27._8_4_ = 0x7fffffff;
          auVar27._0_8_ = 0x7fffffff7fffffff;
          auVar27._12_4_ = 0x7fffffff;
          auVar5 = vpand_avx(ZEXT416((uint)(fVar10 * 0.0)),auVar27);
          local_6c = auVar5._0_4_ + local_6c;
          auVar28._8_4_ = 0x7fffffff;
          auVar28._0_8_ = 0x7fffffff7fffffff;
          auVar28._12_4_ = 0x7fffffff;
          auVar5 = vpand_avx(ZEXT416((uint)(fVar10 * 0.0)),auVar28);
          local_70 = auVar5._0_4_ + local_70;
        }
      }
      fVar11 = expf((local_4c * local_4c + local_50 * local_50) * -0.22222222);
      local_64 = local_64 * fVar11;
      local_68 = local_68 * fVar11;
      local_6c = local_6c * fVar11;
      local_70 = local_70 * fVar11;
      in_RSI[(long)local_44 + 5] = local_64;
      in_RSI[(long)(local_44 + 1) + 5] = local_68;
      in_RSI[(long)(local_44 + 2) + 5] = local_6c;
      in_RSI[(long)(local_44 + 3) + 5] = local_70;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_64),ZEXT416((uint)local_64),
                               ZEXT416((uint)(local_68 * local_68)));
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_6c),ZEXT416((uint)local_6c),auVar3);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_70),ZEXT416((uint)local_70),auVar3);
      local_48 = auVar3._0_4_ + local_48;
      local_44 = local_44 + 4;
    }
  }
LAB_00183212:
  fVar13 = sqrtf(local_48);
  for (local_148 = 0; local_148 < 0x40; local_148 = local_148 + 1) {
    in_RSI[(long)local_148 + 5] = (1.0 / fVar13) * in_RSI[(long)local_148 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_inlinedHaarWavelets_precheck_boundaries(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - using haarXY_precheck_boundaries function to compute Haar Wavelet responses at once with very naive reduction of if/MIN usage

    ideas:
        - more sophisticated boundary checking (before the haarXY_precheck_boundaries function call)
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;


    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    

    } else { // everything in borders
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    }
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}